

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

BVHAggregate *
pbrt::BVHAggregate::Create
          (vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *prims,
          ParameterDictionary *parameters)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  bool bVar4;
  int iVar5;
  BVHAggregate *pBVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  char *in_RDI;
  int maxPrimsInNode;
  SplitMethod splitMethod;
  string splitMethodName;
  SplitMethod in_stack_00000180;
  int in_stack_00000184;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *in_stack_00000188;
  BVHAggregate *in_stack_00000190;
  string *in_stack_fffffffffffffec8;
  ParameterDictionary *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffef8;
  allocator<char> *in_stack_ffffffffffffff00;
  allocator<char> *__a;
  string *def;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  ParameterDictionary *in_stack_ffffffffffffff28;
  allocator<char> local_b9;
  string local_b8 [36];
  int local_94;
  undefined4 local_90;
  allocator<char> local_89;
  string local_88 [55];
  undefined1 local_51 [33];
  string local_30 [48];
  
  def = (string *)local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RSI,in_RDI,in_stack_ffffffffffffff00);
  __a = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RSI,in_RDI,__a);
  ParameterDictionary::GetOneString
            (in_stack_ffffffffffffff28,
             (string *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),def);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)(local_51 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_51);
  uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
  if ((bool)uVar1) {
    local_90 = 0;
  }
  else {
    uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
    if ((bool)uVar2) {
      local_90 = 1;
    }
    else {
      uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
      if ((bool)uVar3) {
        local_90 = 2;
      }
      else {
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
        if (bVar4) {
          local_90 = 3;
        }
        else {
          Warning<std::__cxx11::string&>
                    ((char *)__a,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(bVar4,
                                                  in_stack_fffffffffffffef8)))));
          local_90 = 0;
        }
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RSI,in_RDI,__a);
  iVar5 = ParameterDictionary::GetOneInt(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,0);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  local_94 = iVar5;
  pBVar6 = (BVHAggregate *)operator_new(0x30);
  std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::vector
            ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
             &stack0xffffffffffffff28,
             (vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
             in_stack_fffffffffffffec8);
  BVHAggregate(in_stack_00000190,in_stack_00000188,in_stack_00000184,in_stack_00000180);
  std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::~vector
            ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
             CONCAT44(iVar5,in_stack_fffffffffffffee0));
  std::__cxx11::string::~string(local_30);
  return pBVar6;
}

Assistant:

BVHAggregate *BVHAggregate::Create(std::vector<PrimitiveHandle> prims,
                                   const ParameterDictionary &parameters) {
    std::string splitMethodName = parameters.GetOneString("splitmethod", "sah");
    BVHAggregate::SplitMethod splitMethod;
    if (splitMethodName == "sah")
        splitMethod = BVHAggregate::SplitMethod::SAH;
    else if (splitMethodName == "hlbvh")
        splitMethod = BVHAggregate::SplitMethod::HLBVH;
    else if (splitMethodName == "middle")
        splitMethod = BVHAggregate::SplitMethod::Middle;
    else if (splitMethodName == "equal")
        splitMethod = BVHAggregate::SplitMethod::EqualCounts;
    else {
        Warning(R"(BVH split method "%s" unknown.  Using "sah".)", splitMethodName);
        splitMethod = BVHAggregate::SplitMethod::SAH;
    }

    int maxPrimsInNode = parameters.GetOneInt("maxnodeprims", 4);
    return new BVHAggregate(std::move(prims), maxPrimsInNode, splitMethod);
}